

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.cpp
# Opt level: O0

DatabaseName * __thiscall DatabaseName::derive_temporary(DatabaseName *this)

{
  path *in_RSI;
  DatabaseName *in_RDI;
  string fname;
  string id;
  char *in_stack_fffffffffffffeb0;
  path *ppVar1;
  DatabaseName *__lhs;
  string local_128 [8];
  allocator<char> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  path *in_stack_ffffffffffffff08;
  DatabaseName *in_stack_ffffffffffffff10;
  uint64_t in_stack_ffffffffffffff18;
  string local_e0 [112];
  string local_70 [32];
  string local_50 [32];
  
  ppVar1 = (path *)&stack0xffffffffffffffd0;
  __lhs = in_RDI;
  random_hex_string_abi_cxx11_(in_stack_ffffffffffffff18);
  std::operator+((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string(local_70);
  std::experimental::filesystem::v1::__cxx11::path::path(ppVar1,in_RSI);
  ppVar1 = (path *)&stack0xffffffffffffff1f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffef8,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::string(local_128,local_50);
  DatabaseName(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
  std::experimental::filesystem::v1::__cxx11::path::~path(ppVar1);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

DatabaseName DatabaseName::derive_temporary() const {
    std::string id = random_hex_string(8);
    std::string fname = "temp." + id + ".ursa";
    return DatabaseName(db_base, "temp", id, fname);
}